

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::
strTree<kj::StringTree,char_const(&)[18],kj::String&,char_const(&)[51],kj::String&,char_const(&)[12]>
          (StringTree *__return_storage_ptr__,kj *this,StringTree *params,char (*params_1) [18],
          String *params_2,char (*params_3) [51],String *params_4,char (*params_5) [12])

{
  char *pcVar1;
  Branch *pBVar2;
  ArrayPtr<const_char> *params_5_00;
  ArrayPtr<const_char> AVar3;
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  
  local_60 = toCharSequence<char_const(&)[18]>((char (*) [18])params);
  pcVar1 = *(char **)(*params_1 + 8);
  local_70.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_70.ptr = *(char **)*params_1;
  }
  local_70.size_ = (size_t)(pcVar1 + -1);
  if (pcVar1 == (char *)0x0) {
    local_70.size_ = (size_t)(char *)0x0;
  }
  AVar3 = toCharSequence<char_const(&)[51]>((char (*) [51])params_2);
  params_5_00 = (ArrayPtr<const_char> *)AVar3.ptr;
  pBVar2 = *(Branch **)(*params_3 + 8);
  local_40.ptr = (char *)pBVar2;
  if (pBVar2 != (Branch *)0x0) {
    local_40.ptr = *(char **)*params_3;
  }
  local_40.size_ = (size_t)((long)&pBVar2[-1].content.branches.disposer + 7);
  if (pBVar2 == (Branch *)0x0) {
    local_40.size_ = (size_t)(char *)0x0;
  }
  local_50 = toCharSequence<char_const(&)[12]>((char (*) [12])params_4);
  StringTree::
  concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)this,(StringTree *)&local_60,&local_70,
             (ArrayPtr<const_char> *)&stack0xffffffffffffff80,&local_40,&local_50,params_5_00);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}